

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

char * __thiscall cs_impl::system_cs_ext::getenv(system_cs_ext *this,char *__name)

{
  long lVar1;
  char *__s;
  size_t sVar2;
  long *plVar3;
  long *plVar4;
  ulong *puVar5;
  ulong *puVar6;
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __s = ::getenv(*(char **)__name);
  if (__s != (char *)0x0) {
    *(system_cs_ext **)this = this + 0x10;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)this,__s,__s + sVar2);
    return (char *)this;
  }
  plVar3 = (long *)__cxa_allocate_exception(0x20);
  std::operator+(&local_38,"Environment variable \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__name);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_38);
  puVar5 = (ulong *)*plVar4;
  puVar6 = (ulong *)(plVar4 + 2);
  if (puVar5 == puVar6) {
    local_48 = *puVar6;
    uStack_40 = (undefined4)plVar4[3];
    uStack_3c = *(undefined4 *)((long)plVar4 + 0x1c);
    puVar5 = &local_48;
  }
  else {
    local_48 = *puVar6;
  }
  lVar1 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  *plVar3 = (long)(plVar3 + 2);
  if (puVar5 == &local_48) {
    *(undefined4 *)(plVar3 + 2) = (undefined4)local_48;
    *(undefined4 *)((long)plVar3 + 0x14) = local_48._4_4_;
    *(undefined4 *)(plVar3 + 3) = uStack_40;
    *(undefined4 *)((long)plVar3 + 0x1c) = uStack_3c;
  }
  else {
    *plVar3 = (long)puVar5;
    plVar3[2] = local_48;
  }
  plVar3[1] = lVar1;
  local_48 = local_48 & 0xffffffffffffff00;
  __cxa_throw(plVar3,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
}

Assistant:

string getenv(const string &name)
		{
			const char *str = std::getenv(name.c_str());
			if (str == nullptr)
				throw lang_error("Environment variable \"" + name + "\" is not exist.");
			return str;
		}